

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O1

bool GetFileTime(MGT_DIR *p,tm *ptm_)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  tm *ptVar5;
  time_t tVar6;
  bool bVar7;
  time_t ttNow;
  time_t local_10;
  
  *(undefined8 *)&ptm_->tm_isdst = 0;
  ptm_->tm_gmtoff = 0;
  ptm_->tm_mon = 0;
  ptm_->tm_year = 0;
  ptm_->tm_wday = 0;
  ptm_->tm_yday = 0;
  ptm_->tm_sec = 0;
  ptm_->tm_min = 0;
  ptm_->tm_hour = 0;
  ptm_->tm_mday = 0;
  ptm_->tm_zone = (char *)0x0;
  bVar1 = p->bMonth;
  bVar2 = p->bMinute;
  if ((char)bVar1 < '\0') {
    ptm_->tm_sec = (uint)bVar2 + (uint)bVar2 & 0x3e;
    bVar3 = p->bHour;
    ptm_->tm_min = (bVar3 & 7) + (uint)(bVar2 >> 5) * 8;
    ptm_->tm_hour = (uint)(bVar3 >> 3);
    ptm_->tm_mday = (uint)p->bDay;
    uVar4 = bVar1 >> 3 & 0xe;
  }
  else {
    ptm_->tm_min = (uint)bVar2;
    ptm_->tm_hour = (uint)p->bHour;
    ptm_->tm_mday = (uint)p->bDay;
    uVar4 = bVar1 - 1;
  }
  ptm_->tm_mon = uVar4;
  bVar1 = p->bYear;
  ptm_->tm_year = (uint)bVar1;
  if (bVar1 < 0x50) {
    ptm_->tm_year = bVar1 + 100;
  }
  if (GetFileTime::nYear == 0) {
    local_10 = time((time_t *)0x0);
    ptVar5 = localtime(&local_10);
    GetFileTime::nYear = ptVar5->tm_year + 0x76c;
  }
  if ((((GetFileTime::nYear < ptm_->tm_year + 0x76c) || (0xb < (uint)ptm_->tm_mon)) ||
      (0x1f < ptm_->tm_mday || ptm_->tm_mday == 0)) ||
     (((0x17 < ptm_->tm_hour || (0x3c < ptm_->tm_min)) || (0x3c < ptm_->tm_sec)))) {
    bVar7 = false;
  }
  else {
    ptm_->tm_isdst = -1;
    tVar6 = mktime((tm *)ptm_);
    bVar7 = tVar6 != -1;
  }
  return bVar7;
}

Assistant:

bool GetFileTime(const MGT_DIR* p, struct tm* ptm_)
{
    memset(ptm_, 0, sizeof(*ptm_));

    // Check for a packed BDOS 1.4+ date
    if (p->bMonth & 0x80)
    {
        ptm_->tm_sec = (p->bMinute & 0x1f) << 1;
        ptm_->tm_min = ((p->bMinute & 0xe0) >> 2) | (p->bHour & 0x07);
        ptm_->tm_hour = (p->bHour & 0xf8) >> 3;
        //      ptm_->tm_wday =   p->bMonth & 0x07;         // mktime does this for us
        ptm_->tm_mday = p->bDay;
        ptm_->tm_mon = (p->bMonth & 0x71) >> 3;
        ptm_->tm_year = p->bYear;
    }

    // Normal format
    else
    {
        ptm_->tm_min = p->bMinute;
        ptm_->tm_hour = p->bHour;
        ptm_->tm_mday = p->bDay;
        ptm_->tm_mon = p->bMonth - 1;
        ptm_->tm_year = p->bYear;
    }

    // Base smaller year values from 2000 (BDOS considers <80 to be invalid)
    if (ptm_->tm_year < 80)
        ptm_->tm_year += 100;

    // Fetch the current year, if not already cached
    static int nYear = 0;
    if (!nYear)
    {
        time_t ttNow = time(nullptr);
        struct tm* tmNow = localtime(&ttNow);
        nYear = 1900 + tmNow->tm_year;
    }

    // Reject obviously invalid date components
    if (1900 + ptm_->tm_year > nYear ||
        ptm_->tm_mon < 0 || ptm_->tm_mon >= 12 ||
        ptm_->tm_mday == 0 || ptm_->tm_mday >  31 ||
        ptm_->tm_hour > 23 || ptm_->tm_min > 60 || ptm_->tm_sec > 60)
        return false;

    // All dates are taken to be in the local timezone, not UCT/GMT
    ptm_->tm_isdst = -1;

    // Validate the date components
    return mktime(ptm_) != -1;
}